

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::Mesh::unkeyframe(Mesh *this,double t)

{
  double in_RDI;
  Skeleton *in_XMM0_Qa;
  double in_stack_00000048;
  double in_stack_00000050;
  Spline<CMU462::Vector3D> *in_stack_00000058;
  
  Spline<CMU462::Vector3D>::removeKnot(in_stack_00000058,in_stack_00000050,in_stack_00000048);
  Spline<CMU462::Vector3D>::removeKnot(in_stack_00000058,in_stack_00000050,in_stack_00000048);
  Spline<CMU462::Vector3D>::removeKnot(in_stack_00000058,in_stack_00000050,in_stack_00000048);
  if (*(long *)((long)in_RDI + 0x168) != 0) {
    Skeleton::unkeyframe(in_XMM0_Qa,in_RDI);
  }
  return;
}

Assistant:

void Mesh::unkeyframe(double t) {
  positions.removeKnot(t, 0.1);
  rotations.removeKnot(t, 0.1);
  scales.removeKnot(t, 0.1);
  if (skeleton) skeleton->unkeyframe(t);
}